

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags,uint32_t total_orderings_to_try,
                      uint32_t total_orderings_to_try3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  undefined4 uVar7;
  uint8_t auVar8 [16];
  byte bVar9;
  undefined1 uVar20;
  short sVar10;
  uint32_t i;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  byte bVar21;
  undefined1 uVar28;
  short sVar22;
  uint uVar23;
  uint uVar24;
  uint32_t lg;
  uint32_t uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar29;
  uint uVar30;
  uint32_t lr;
  int iVar31;
  short sVar32;
  uint32_t hb;
  uint32_t uVar33;
  uint32_t uVar34;
  ulong uVar35;
  ulong uVar36;
  uint32_t uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  long lVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  uint32_t lb;
  uint8_t *puVar47;
  uint32_t uVar48;
  uint uVar49;
  uint uVar50;
  int i_11;
  uint32_t uVar51;
  int iVar52;
  uint32_t hr;
  uint32_t uVar53;
  int iVar54;
  int iVar55;
  bool bVar56;
  bool bVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  int iVar62;
  int iVar63;
  float fVar64;
  int iVar65;
  int iVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  uint32_t local_328;
  uint local_320;
  uint32_t local_318;
  uint local_308;
  uint32_t local_300;
  ulong local_2f0;
  ulong local_2e8;
  uint32_t local_2e0;
  bc1_encode_results results;
  ulong local_2a0;
  uint32_t local_294;
  uint32_t local_290;
  uint32_t local_28c;
  uint32_t local_288;
  hist3 h_1;
  ulong local_280;
  ulong local_278;
  uint local_264;
  uint local_250;
  ulong local_248;
  ulong local_238;
  ulong local_230;
  hist4 h;
  undefined4 uStack_214;
  undefined8 uStack_210;
  uint8_t trial_sels_1 [16];
  uint local_1ac;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  uint8_t round_sels [16];
  uint8_t trial_sels [16];
  undefined8 local_108;
  uint32_t b_sum [17];
  int dots [16];
  ulong uVar42;
  
  bVar9 = *pPixels;
  uVar50 = (uint)bVar9;
  bVar21 = pPixels[1];
  uVar44 = (uint)bVar21;
  bVar3 = pPixels[2];
  local_188 = (ulong)bVar3;
  uVar11 = 0xf;
  while (((uVar17 = (ulong)uVar11, pPixels[uVar17 * 4] == bVar9 &&
          (pPixels[uVar17 * 4 + 1] == bVar21)) && (pPixels[uVar17 * 4 + 2] == bVar3))) {
    uVar11 = uVar11 - 1;
    if (uVar11 == 0) {
      encode_bc1_solid_block(pDst,(uint)bVar9,(uint)bVar21,(uint)bVar3,(flags & 0x18) != 0);
      return;
    }
  }
  bVar57 = bVar9 == bVar21 && bVar9 == bVar3;
  uVar41 = (uint)bVar9;
  bVar56 = (byte)(bVar21 | bVar9 | bVar3) < 4;
  lVar16 = 1;
  uVar11 = (uint)bVar21;
  local_178 = (ulong)uVar41;
  local_180 = (ulong)uVar11;
  uVar17 = local_188;
  uVar36 = local_188;
  do {
    bVar9 = pPixels[lVar16 * 4];
    bVar21 = pPixels[lVar16 * 4 + 2];
    bVar3 = pPixels[lVar16 * 4 + 1];
    if (bVar21 != bVar9 || bVar9 != bVar3) {
      bVar57 = false;
    }
    bVar56 = (bool)(bVar56 | (byte)(bVar3 | bVar9 | bVar21) < 4);
    uVar23 = (uint)bVar9;
    if ((uint)local_178 <= uVar23) {
      local_178 = (ulong)uVar23;
    }
    if ((uint)local_180 <= (uint)bVar3) {
      local_180 = (ulong)(uint)bVar3;
    }
    if ((uint)local_188 <= (uint)bVar21) {
      local_188 = (ulong)(uint)bVar21;
    }
    if (uVar23 <= uVar41) {
      uVar41 = uVar23;
    }
    uVar29 = (uint)bVar3;
    if (uVar29 <= uVar11) {
      uVar11 = uVar29;
    }
    uVar49 = (uint)bVar21;
    if (uVar49 <= (uint)uVar17) {
      uVar17 = (ulong)uVar49;
    }
    uVar50 = uVar50 + uVar23;
    uVar44 = uVar44 + uVar29;
    uVar49 = (int)uVar36 + uVar49;
    uVar36 = (ulong)uVar49;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x10);
  uVar23 = uVar50 + 8 >> 4;
  uVar36 = (ulong)uVar23;
  uVar29 = uVar44 + 8 >> 4;
  uVar27 = (ulong)uVar29;
  uVar38 = uVar49 + 8 >> 4;
  uVar42 = (ulong)uVar38;
  results.m_3color = false;
  results.lr = 0;
  results.lg = 0;
  results.lb = 0;
  results.hr = 0;
  results.hg = 0;
  results.hb = 0;
  local_1a8 = uVar27;
  local_1a0 = uVar42;
  local_198 = uVar27;
  local_190 = uVar36;
  if (((flags & 0xffc00112) != 0) || (((flags & 8) != 0 && (bVar56)))) {
    uVar23 = 0xffffffff;
    bVar9 = 1;
    local_288 = 0;
    local_28c = 0;
    local_290 = 0;
    local_294 = 0;
    local_238 = 0;
    local_230 = 0;
    uVar25 = flags;
    do {
      encode_bc1_pick_initial
                ((color32 *)pPixels,uVar25,bVar57,uVar41,uVar11,(int)uVar17,(int)local_178,
                 (int)local_180,(int)local_188,(int)local_190,(int)local_198,(int)local_1a0,uVar50,
                 uVar44,uVar49,(int *)b_sum,dots,(int *)trial_sels_1,(int *)&h,(int *)&h_1,
                 (int *)&local_1ac);
      iVar31 = dots[0];
      uVar48 = _h_1;
      uVar51 = b_sum[0];
      uVar7 = trial_sels_1._0_4_;
      uVar25 = CONCAT13(h.m_hist[3],CONCAT12(h.m_hist[2],CONCAT11(h.m_hist[1],h.m_hist[0])));
      uVar19 = (ulong)_h_1;
      local_170 = (ulong)local_1ac;
      uVar29 = bc1_find_sels4(flags,(color32 *)pPixels,b_sum[0],dots[0],trial_sels_1._0_4_,uVar25,
                              _h_1,local_1ac,round_sels,0xffffffff);
      bVar21 = 1;
      local_2f0 = local_170 & 0xffffffff;
      uVar53 = uVar51;
      uVar14 = iVar31;
      uVar34 = uVar7;
      uVar37 = uVar25;
      do {
        lVar16 = 0;
        uVar30 = 0;
        uVar38 = 0;
        uVar24 = 0;
        uVar39 = 0;
        do {
          bVar3 = round_sels[lVar16];
          uVar39 = uVar39 + *(int *)(g_weight_vals4 + (ulong)bVar3 * 4);
          uVar30 = uVar30 + (uint)pPixels[lVar16 * 4] * (uint)bVar3;
          uVar38 = uVar38 + (uint)pPixels[lVar16 * 4 + 1] * (uint)bVar3;
          uVar24 = uVar24 + (uint)pPixels[lVar16 * 4 + 2] * (uint)bVar3;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        fVar64 = (float)(uVar39 >> 0x10 & 0xff);
        uVar45 = uVar39 >> 8 & 0xff;
        fVar67 = fVar64 * (float)(uVar39 & 0xff) - (float)(uVar45 * uVar45);
        if (ABS(fVar67) < 1e-08) {
          lr = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3];
          lg = (uint32_t)(byte)g_bc1_match6_equals_1[uVar27 * 3];
          lb = (uint32_t)(byte)g_bc1_match5_equals_1[uVar42 * 3];
          hr = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3 + 1];
          uVar38 = (uint)(byte)g_bc1_match6_equals_1[uVar27 * 3 + 1];
          uVar35 = (ulong)(byte)g_bc1_match5_equals_1[uVar42 * 3 + 1];
        }
        else {
          fVar67 = 0.011764706 / fVar67;
          fVar61 = (float)(uVar39 & 0xff) * fVar67;
          fVar58 = (float)((uint)(float)uVar45 | 0x80000000) * fVar67;
          fVar67 = fVar67 * fVar64;
          fVar64 = (float)(int)(uVar50 * 3 - uVar30);
          fVar71 = fVar61 * (float)uVar30 + fVar58 * fVar64;
          fVar75 = (float)(int)(uVar49 * 3 - uVar24);
          fVar68 = (float)uVar30 * fVar58 + fVar64 * fVar67;
          fVar70 = fVar61 * (float)uVar24 + fVar58 * fVar75;
          fVar64 = (float)uVar24 * fVar58 + fVar75 * fVar67;
          uVar24 = (uint)(fVar71 * 31.0);
          uVar39 = (uint)(fVar70 * 31.0);
          uVar30 = (uint)(fVar68 * 31.0);
          uVar45 = (uint)(fVar64 * 31.0);
          if (0x1f < (uVar45 | uVar24 | uVar39 | uVar30)) {
            if ((int)uVar24 < 1) {
              uVar24 = 0;
            }
            if (0x1e < (int)uVar24) {
              uVar24 = 0x1f;
            }
            if ((int)uVar30 < 1) {
              uVar30 = 0;
            }
            if (0x1e < (int)uVar30) {
              uVar30 = 0x1f;
            }
            if ((int)uVar39 < 1) {
              uVar39 = 0;
            }
            if (0x1e < (int)uVar39) {
              uVar39 = 0x1f;
            }
            if ((int)uVar45 < 1) {
              uVar45 = 0;
            }
            if (0x1e < (int)uVar45) {
              uVar45 = 0x1f;
            }
          }
          fVar75 = (float)(int)(uVar44 * 3 - uVar38);
          fVar61 = fVar61 * (float)uVar38 + fVar58 * fVar75;
          fVar67 = fVar58 * (float)uVar38 + fVar67 * fVar75;
          uVar38 = (uint)(fVar61 * 63.0);
          uVar12 = (uint)(fVar67 * 63.0);
          if (0x3f < (uVar12 | uVar38)) {
            if ((int)uVar38 < 1) {
              uVar38 = 0;
            }
            if (0x3e < (int)uVar38) {
              uVar38 = 0x3f;
            }
            if ((int)uVar12 < 1) {
              uVar12 = 0;
            }
            if (0x3e < (int)uVar12) {
              uVar12 = 0x3f;
            }
          }
          hr = (*(float *)(g_midpoint5 + (ulong)uVar24 * 4) <= fVar71 &&
               fVar71 != *(float *)(g_midpoint5 + (ulong)uVar24 * 4)) + uVar24 & 0x1f;
          uVar38 = (*(float *)(g_midpoint6 + (ulong)uVar38 * 4) <= fVar61 &&
                   fVar61 != *(float *)(g_midpoint6 + (ulong)uVar38 * 4)) + uVar38 & 0x3f;
          uVar35 = (ulong)(uVar39 + (*(float *)(g_midpoint5 + (long)(int)uVar39 * 4) <= fVar70 &&
                                    fVar70 != *(float *)(g_midpoint5 + (long)(int)uVar39 * 4)) &
                          0x1f);
          lr = uVar30 + (*(float *)(g_midpoint5 + (long)(int)uVar30 * 4) <= fVar68 &&
                        fVar68 != *(float *)(g_midpoint5 + (long)(int)uVar30 * 4)) & 0x1f;
          lg = (*(float *)(g_midpoint6 + (ulong)uVar12 * 4) <= fVar67 &&
               fVar67 != *(float *)(g_midpoint6 + (ulong)uVar12 * 4)) + uVar12 & 0x3f;
          lb = uVar45 + (*(float *)(g_midpoint5 + (long)(int)uVar45 * 4) <= fVar64 &&
                        fVar64 != *(float *)(g_midpoint5 + (long)(int)uVar45 * 4)) & 0x1f;
        }
        hb = (uint32_t)uVar35;
        uVar33 = (uint32_t)local_2f0;
        if ((((uVar53 == lr) && (uVar14 == lg)) &&
            ((uVar34 == lb &&
             (((uVar37 == hr && (uVar48 == uVar38)) && ((uint32_t)local_2f0 == hb)))))) ||
           (uVar13 = bc1_find_sels4(flags,(color32 *)pPixels,lr,lg,lb,hr,uVar38,hb,trial_sels,uVar29
                                   ), uVar29 <= uVar13)) break;
        round_sels[0] = trial_sels[0];
        round_sels[1] = trial_sels[1];
        round_sels[2] = trial_sels[2];
        round_sels[3] = trial_sels[3];
        round_sels[4] = trial_sels[4];
        round_sels[5] = trial_sels[5];
        round_sels[6] = trial_sels[6];
        round_sels[7] = trial_sels[7];
        round_sels[8] = trial_sels[8];
        round_sels[9] = trial_sels[9];
        round_sels[10] = trial_sels[10];
        round_sels[0xb] = trial_sels[0xb];
        round_sels[0xc] = trial_sels[0xc];
        round_sels[0xd] = trial_sels[0xd];
        round_sels[0xe] = trial_sels[0xe];
        round_sels[0xf] = trial_sels[0xf];
        bVar3 = bVar21 & (byte)((flags & 4) >> 2);
        bVar21 = 0;
        uVar53 = lr;
        uVar37 = hr;
        uVar14 = lg;
        uVar29 = uVar13;
        uVar34 = lb;
        local_2f0 = uVar35;
        uVar48 = uVar38;
        uVar33 = hb;
      } while (bVar3 != 0);
      auVar8 = trial_sels_1;
      if (uVar29 <= uVar23) {
        results.hb = uVar33;
        results.hg = uVar48;
        results.sels[4] = round_sels[4];
        results.sels[5] = round_sels[5];
        results.sels[6] = round_sels[6];
        results.sels[7] = round_sels[7];
        results.sels[0] = round_sels[0];
        results.sels[1] = round_sels[1];
        results.sels[2] = round_sels[2];
        results.sels[3] = round_sels[3];
        results.sels[0xc] = round_sels[0xc];
        results.sels[0xd] = round_sels[0xd];
        results.sels[0xe] = round_sels[0xe];
        results.sels[0xf] = round_sels[0xf];
        results.sels[8] = round_sels[8];
        results.sels[9] = round_sels[9];
        results.sels[10] = round_sels[10];
        results.sels[0xb] = round_sels[0xb];
        local_230 = local_170;
        trial_sels_1[0] = (uint8_t)uVar7;
        trial_sels_1[1] = SUB41(uVar7,1);
        trial_sels_1[2] = SUB41(uVar7,2);
        trial_sels_1[3] = SUB41(uVar7,3);
        local_290._0_1_ = trial_sels_1[0];
        local_290._1_1_ = trial_sels_1[1];
        local_290._2_1_ = trial_sels_1[2];
        local_290._3_1_ = trial_sels_1[3];
        local_28c = iVar31;
        local_288 = uVar51;
        uVar23 = uVar29;
        local_294 = uVar25;
        local_238 = uVar19;
        results.lr = uVar53;
        results.lg = uVar14;
        results.lb = uVar34;
        results.hr = uVar37;
      }
      bVar21 = (byte)(flags >> 0xe) & 1 & bVar9;
      bVar9 = 0;
      uVar25 = flags & 0xfffffdbf | 0x40;
      trial_sels_1 = auVar8;
    } while (bVar21 != 0);
  }
  else {
    encode_bc1_pick_initial
              ((color32 *)pPixels,flags,bVar57,uVar41,uVar11,(int)uVar17,(int)local_178,
               (int)local_180,(int)local_188,uVar23,uVar29,uVar38,uVar50,uVar44,uVar49,&results.lr,
               &results.lg,&results.lb,&results.hr,&results.hg,&results.hb);
    local_238 = results._16_8_ & 0xffffffff;
    local_230 = (ulong)(uint)results.hb;
    local_288 = results.lr;
    local_28c = results.lg;
    local_290 = results.lb;
    local_294 = results.hr;
    bc1_find_sels4_noerr
              ((color32 *)pPixels,results.lr,results.lg,results.lb,results.hr,results.hg,results.hb,
               results.sels);
    bVar9 = 1;
    do {
      lVar16 = 0;
      uVar23 = 0;
      uVar11 = 0;
      uVar41 = 0;
      uVar29 = 0;
      do {
        bVar21 = results.sels[lVar16];
        uVar29 = uVar29 + *(int *)(g_weight_vals4 + (ulong)bVar21 * 4);
        uVar23 = uVar23 + (uint)pPixels[lVar16 * 4] * (uint)bVar21;
        uVar11 = uVar11 + (uint)pPixels[lVar16 * 4 + 1] * (uint)bVar21;
        uVar41 = uVar41 + (uint)pPixels[lVar16 * 4 + 2] * (uint)bVar21;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      fVar64 = (float)(uVar29 >> 0x10 & 0xff);
      uVar38 = uVar29 >> 8 & 0xff;
      fVar67 = fVar64 * (float)(uVar29 & 0xff) - (float)(uVar38 * uVar38);
      if (ABS(fVar67) < 1e-08) {
        uVar53 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3];
        uVar34 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar27 * 3];
        uVar25 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar42 * 3];
        uVar48 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3 + 1];
        uVar37 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar27 * 3 + 1];
        uVar51 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar42 * 3 + 1];
      }
      else {
        fVar67 = 0.011764706 / fVar67;
        fVar61 = (float)(uVar29 & 0xff) * fVar67;
        fVar58 = (float)((uint)(float)uVar38 | 0x80000000) * fVar67;
        fVar67 = fVar67 * fVar64;
        fVar64 = (float)(int)(uVar50 * 3 - uVar23);
        fVar71 = fVar61 * (float)uVar23 + fVar58 * fVar64;
        fVar75 = (float)(int)(uVar49 * 3 - uVar41);
        fVar68 = (float)uVar23 * fVar58 + fVar64 * fVar67;
        fVar70 = fVar61 * (float)uVar41 + fVar58 * fVar75;
        fVar64 = (float)uVar41 * fVar58 + fVar75 * fVar67;
        uVar38 = (uint)(fVar71 * 31.0);
        uVar23 = (uint)(fVar70 * 31.0);
        uVar41 = (uint)(fVar68 * 31.0);
        uVar29 = (uint)(fVar64 * 31.0);
        if (0x1f < (uVar29 | uVar38 | uVar23 | uVar41)) {
          if ((int)uVar38 < 1) {
            uVar38 = 0;
          }
          if (0x1e < (int)uVar38) {
            uVar38 = 0x1f;
          }
          if ((int)uVar41 < 1) {
            uVar41 = 0;
          }
          if (0x1e < (int)uVar41) {
            uVar41 = 0x1f;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          if (0x1e < (int)uVar23) {
            uVar23 = 0x1f;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if (0x1e < (int)uVar29) {
            uVar29 = 0x1f;
          }
        }
        fVar75 = (float)(int)(uVar44 * 3 - uVar11);
        fVar61 = fVar61 * (float)uVar11 + fVar58 * fVar75;
        fVar67 = fVar58 * (float)uVar11 + fVar67 * fVar75;
        uVar24 = (uint)(fVar61 * 63.0);
        uVar11 = (uint)(fVar67 * 63.0);
        if (0x3f < (uVar11 | uVar24)) {
          if ((int)uVar24 < 1) {
            uVar24 = 0;
          }
          if (0x3e < (int)uVar24) {
            uVar24 = 0x3f;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (0x3e < (int)uVar11) {
            uVar11 = 0x3f;
          }
        }
        uVar48 = (*(float *)(g_midpoint5 + (ulong)uVar38 * 4) <= fVar71 &&
                 fVar71 != *(float *)(g_midpoint5 + (ulong)uVar38 * 4)) + uVar38 & 0x1f;
        uVar37 = (*(float *)(g_midpoint6 + (ulong)uVar24 * 4) <= fVar61 &&
                 fVar61 != *(float *)(g_midpoint6 + (ulong)uVar24 * 4)) + uVar24 & 0x3f;
        uVar51 = uVar23 + (*(float *)(g_midpoint5 + (long)(int)uVar23 * 4) <= fVar70 &&
                          fVar70 != *(float *)(g_midpoint5 + (long)(int)uVar23 * 4)) & 0x1f;
        uVar53 = uVar41 + (*(float *)(g_midpoint5 + (long)(int)uVar41 * 4) <= fVar68 &&
                          fVar68 != *(float *)(g_midpoint5 + (long)(int)uVar41 * 4)) & 0x1f;
        uVar34 = (*(float *)(g_midpoint6 + (ulong)uVar11 * 4) <= fVar67 &&
                 fVar67 != *(float *)(g_midpoint6 + (ulong)uVar11 * 4)) + uVar11 & 0x3f;
        uVar25 = uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= fVar64 &&
                          fVar64 != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4)) & 0x1f;
      }
      uVar23 = 0xffffffff;
      if (((results.lr == uVar53) && (results.lg == uVar34)) &&
         (((results.lb == uVar25 && ((results.hr == uVar48 && (results.hg == uVar37)))) &&
          (results.hb == uVar51)))) goto LAB_0011898a;
      bc1_find_sels4_noerr
                ((color32 *)pPixels,uVar53,uVar34,uVar25,uVar48,uVar37,uVar51,results.sels);
      results.hb = uVar51;
      results.hg = uVar37;
      bVar21 = bVar9 & (byte)((flags & 4) >> 2);
      bVar9 = 0;
      results.lr = uVar53;
      results.lg = uVar34;
      results.lb = uVar25;
      results.hr = uVar48;
    } while (bVar21 != 0);
    uVar23 = 0xffffffff;
  }
LAB_0011898a:
  if (((flags & 2) != 0) && (uVar23 != 0)) {
    uVar25 = 0x80;
    if (total_orderings_to_try < 0x80) {
      uVar25 = total_orderings_to_try;
    }
    uVar11 = 1;
    if (0 < (int)total_orderings_to_try) {
      uVar11 = uVar25;
    }
    lVar16 = local_1a8 * 3;
    uVar17 = 0x3c9;
    if ((flags >> 0xd & 1) == 0) {
      uVar17 = (ulong)uVar11;
    }
    bVar9 = 1;
    local_264 = uVar23;
    while( true ) {
      h.m_hist[0] = '\0';
      h.m_hist[1] = '\0';
      h.m_hist[2] = '\0';
      h.m_hist[3] = '\0';
      lVar18 = 0x18;
      do {
        h.m_hist[results.sels[lVar18 + -0x18]] = h.m_hist[results.sels[lVar18 + -0x18]] + '\x01';
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x28);
      local_320 = 0xf;
      if ((((h.m_hist[0] != '\x10') && (local_320 = 700, h.m_hist[1] != '\x10')) &&
          (local_320 = 0x2f1, h.m_hist[2] != '\x10')) && (local_320 = 0x203, h.m_hist[3] != '\x10'))
      {
        local_320 = (uint)*(ushort *)
                           (g_total_ordering4_hash +
                           ((uint)h.m_hist[2] << 9 | (uint)h.m_hist[1] << 5 | (uint)h.m_hist[0] * 2)
                           );
      }
      lVar18 = 0;
      do {
        dots[lVar18] = (uint)pPixels[lVar18 * 4 + 2] *
                       (((uint)results.hb >> 2 | results.hb * 8) -
                       ((uint)results.lb >> 2 | results.lb * 8)) * 0x10 +
                       (uint)pPixels[lVar18 * 4 + 1] *
                       (((uint)results.hg >> 4 | results.hg * 4) -
                       ((uint)results.lg >> 4 | results.lg * 4)) * 0x10 +
                       (uint)pPixels[lVar18 * 4] *
                       (((uint)results.hr >> 2 | results.hr * 8) -
                       ((uint)results.lr >> 2 | results.lr * 8)) * 0x10 + (int)lVar18 + 0x10000000;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(dots);
      lVar18 = 0;
      uVar25 = 0;
      iVar31 = 0;
      iVar40 = 0;
      do {
        uVar27 = (ulong)(dots[lVar18] & 0xf);
        *(int *)(round_sels + lVar18 * 4) = iVar40;
        *(int *)(trial_sels + lVar18 * 4) = iVar31;
        b_sum[lVar18] = uVar25;
        iVar40 = iVar40 + (uint)pPixels[uVar27 * 4];
        iVar31 = iVar31 + (uint)pPixels[uVar27 * 4 + 1];
        uVar25 = uVar25 + pPixels[uVar27 * 4 + 2];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      b_sum[0x10] = uVar49;
      uVar23 = local_264;
      if (uVar17 == 0) break;
      uVar27 = 0;
      do {
        if ((flags >> 0xd & 1) == 0) {
          uVar11 = (uint)*(ushort *)(g_best_total_orderings4 + (ulong)(local_320 << 8) + uVar27 * 2)
          ;
        }
        else {
          uVar11 = (uint)uVar27;
        }
        if ((int)uVar11 < 700) {
          if ((uVar11 != 0xf) && (uVar11 != 0x203)) goto LAB_00118d5a;
LAB_00118c9f:
          uVar25 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3];
          uVar53 = (uint32_t)(byte)g_bc1_match6_equals_1[lVar16];
          uVar34 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar42 * 3];
          uVar48 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar36 * 3 + 1];
          uVar37 = (uint32_t)(byte)g_bc1_match6_equals_1[lVar16 + 1];
          uVar51 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar42 * 3 + 1];
        }
        else {
          if ((uVar11 == 0x2f1) || (uVar11 == 700)) goto LAB_00118c9f;
LAB_00118d5a:
          uVar19 = (ulong)uVar11;
          bVar21 = (&g_unique_total_orders4)[uVar19 * 4];
          uVar35 = (ulong)(((uint)(byte)(&DAT_00124421)[uVar19 * 4] + (uint)bVar21) * 4);
          lVar18 = (ulong)bVar21 * 4;
          uVar46 = (ulong)(((uint)(byte)(&DAT_00124422)[uVar19 * 4] +
                           (uint)(byte)(&DAT_00124421)[uVar19 * 4] + (uint)bVar21) * 4);
          uVar11 = (uVar50 - *(int *)(round_sels + uVar46)) * 3 +
                   (-*(int *)(round_sels + uVar35) - *(int *)(round_sels + lVar18)) +
                   *(int *)(round_sels + uVar46) * 2;
          uVar29 = (uVar44 - *(int *)(trial_sels + uVar46)) * 3 +
                   (-*(int *)(trial_sels + uVar35) - *(int *)(trial_sels + lVar18)) +
                   *(int *)(trial_sels + uVar46) * 2;
          fVar75 = (float)(uVar50 * 3 - uVar11);
          uVar41 = (uVar49 - *(int *)((long)b_sum + uVar46)) * 3 +
                   (-*(int *)((long)b_sum + uVar35) - b_sum[bVar21]) +
                   *(int *)((long)b_sum + uVar46) * 2;
          fVar68 = (float)(uVar44 * 3 - uVar29);
          fVar72 = (float)(uVar49 * 3 - uVar41);
          fVar58 = (float)uVar11;
          fVar64 = (float)uVar29;
          fVar76 = (float)uVar41;
          uVar1 = *(undefined8 *)((long)&g_selector_factors4 + uVar19 * 0xc);
          uVar2 = *(undefined8 *)((long)&g_selector_factors4 + uVar19 * 0xc + 4);
          fVar73 = (float)uVar2;
          fVar74 = (float)((ulong)uVar2 >> 0x20);
          fVar61 = (float)uVar1;
          fVar70 = (float)((ulong)uVar1 >> 0x20);
          fVar67 = fVar64 * fVar61 + fVar68 * fVar73;
          fVar64 = fVar64 * fVar70 + fVar68 * fVar74;
          fVar71 = fVar61 * fVar76 + fVar72 * fVar70;
          fVar68 = fVar70 * fVar76 + (float)(&DAT_0016d598)[uVar19 * 3] * fVar72;
          uVar41 = (uint)(fVar71 * 31.0);
          fVar61 = fVar58 * fVar61 + fVar75 * fVar73;
          fVar58 = fVar58 * fVar70 + fVar75 * fVar74;
          uVar38 = (uint)(fVar61 * 31.0);
          uVar11 = (uint)(fVar58 * 31.0);
          uVar29 = (uint)(fVar68 * 31.0);
          if (0x1f < (uVar38 | uVar41 | uVar11 | uVar29)) {
            if ((int)uVar38 < 1) {
              uVar38 = 0;
            }
            if (0x1e < (int)uVar38) {
              uVar38 = 0x1f;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if (0x1e < (int)uVar11) {
              uVar11 = 0x1f;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            if (0x1e < (int)uVar41) {
              uVar41 = 0x1f;
            }
            if ((int)uVar29 < 1) {
              uVar29 = 0;
            }
            if (0x1e < (int)uVar29) {
              uVar29 = 0x1f;
            }
          }
          uVar24 = (uint)(fVar67 * 63.0);
          uVar30 = (uint)(fVar64 * 63.0);
          if (0x3f < (uVar30 | uVar24)) {
            uVar24 = -(uint)((int)0 < (int)uVar24) & uVar24;
            uVar30 = -(uint)((int)0 < (int)uVar30) & uVar30;
            uVar39 = -(uint)((int)uVar24 < 0x3f);
            uVar45 = -(uint)((int)uVar30 < 0x3f);
            uVar24 = ~uVar39 & 0x3f | uVar24 & uVar39;
            uVar30 = ~uVar45 & 0x3f | uVar30 & uVar45;
          }
          uVar48 = (*(float *)(g_midpoint5 + (ulong)uVar38 * 4) <= fVar61 &&
                   fVar61 != *(float *)(g_midpoint5 + (ulong)uVar38 * 4)) + uVar38 & 0x1f;
          uVar37 = (*(float *)(g_midpoint6 + (ulong)uVar24 * 4) <= fVar67 &&
                   fVar67 != *(float *)(g_midpoint6 + (ulong)uVar24 * 4)) + uVar24 & 0x3f;
          uVar51 = uVar41 + (*(float *)(g_midpoint5 + (long)(int)uVar41 * 4) <= fVar71 &&
                            fVar71 != *(float *)(g_midpoint5 + (long)(int)uVar41 * 4)) & 0x1f;
          uVar25 = uVar11 + (*(float *)(g_midpoint5 + (long)(int)uVar11 * 4) <= fVar58 &&
                            fVar58 != *(float *)(g_midpoint5 + (long)(int)uVar11 * 4)) & 0x1f;
          uVar53 = (*(float *)(g_midpoint6 + (ulong)uVar30 * 4) <= fVar64 &&
                   fVar64 != *(float *)(g_midpoint6 + (ulong)uVar30 * 4)) + uVar30 & 0x3f;
          uVar34 = (*(float *)(g_midpoint5 + (ulong)uVar29 * 4) <= fVar68 &&
                   fVar68 != *(float *)(g_midpoint5 + (ulong)uVar29 * 4)) + uVar29 & 0x1f;
        }
        uVar14 = bc1_find_sels4(flags,(color32 *)pPixels,uVar25,uVar53,uVar34,uVar48,uVar37,uVar51,
                                trial_sels_1,uVar23);
        auVar8 = trial_sels_1;
        if (uVar14 < uVar23) {
          results.hb = uVar51;
          results.hg = uVar37;
          results.sels[0] = trial_sels_1[0];
          results.sels[1] = trial_sels_1[1];
          results.sels[2] = trial_sels_1[2];
          results.sels[3] = trial_sels_1[3];
          results.sels[4] = trial_sels_1[4];
          results.sels[5] = trial_sels_1[5];
          results.sels[6] = trial_sels_1[6];
          results.sels[7] = trial_sels_1[7];
          results.sels[8] = trial_sels_1[8];
          results.sels[9] = trial_sels_1[9];
          results.sels[10] = trial_sels_1[10];
          results.sels[0xb] = trial_sels_1[0xb];
          results.sels[0xc] = trial_sels_1[0xc];
          results.sels[0xd] = trial_sels_1[0xd];
          results.sels[0xe] = trial_sels_1[0xe];
          results.sels[0xf] = trial_sels_1[0xf];
          results.lr = uVar25;
          results.lg = uVar53;
          results.lb = uVar34;
          results.hr = uVar48;
          uVar23 = uVar14;
        }
        uVar27 = uVar27 + 1;
        trial_sels_1 = auVar8;
      } while (uVar17 != uVar27);
      if (((uVar23 == 0) || (uVar23 == local_264)) ||
         (bVar21 = bVar9 & (byte)((flags & 0x20) >> 5), bVar9 = 0, local_264 = uVar23, bVar21 == 0))
      break;
    }
  }
  if (((flags & 0x18) != 0) && (uVar23 != 0)) {
    if ((flags & 0x10) != 0) {
      local_2e8._0_4_ = (uint32_t)local_238;
      local_2a0._0_4_ = (uint32_t)local_230;
      uVar25 = bc1_find_sels3_fullerr
                         (false,(color32 *)pPixels,local_288,local_28c,local_290,local_294,
                          (uint32_t)local_2e8,(uint32_t)local_2a0,trial_sels_1,0xffffffff);
      if (uVar25 == 0) {
        local_2f0._0_4_ = local_294;
        uVar34 = 0;
      }
      else {
        lVar16 = uVar36 * 3;
        lVar18 = local_1a8 * 3;
        lVar6 = uVar42 * 3;
        bVar9 = 1;
        do {
          lVar43 = 0;
          iVar31 = 0;
          uVar11 = 0;
          iVar40 = 0;
          iVar65 = 0;
          iVar66 = 0;
          iVar62 = 0;
          iVar63 = 0;
          do {
            uVar17 = (ulong)trial_sels_1[lVar43];
            if (uVar17 != 3) {
              uVar11 = uVar11 + (&g_weight_vals3)[uVar17];
              bVar21 = *(byte *)((long)&compute_least_squares_endpoints3_rgb(bool,rgbcx::color32_const*,unsigned_char_const*,rgbcx::vec3F*,rgbcx::vec3F*)
                                        ::s_tran + uVar17);
              iVar31 = iVar31 + (uint)bVar21 * (uint)pPixels[lVar43 * 4 + 1];
              auVar59._8_8_ = 0;
              auVar59._0_8_ =
                   (ulong)pPixels[lVar43 * 4] | (ulong)(uint)pPixels[lVar43 * 4 + 2] << 0x20;
              auVar59 = pmaddwd(ZEXT516(CONCAT14(bVar21,(uint)bVar21)),auVar59);
              iVar65 = iVar65 + auVar59._0_4_;
              iVar66 = iVar66 + auVar59._4_4_;
              iVar40 = iVar40 + (uint)pPixels[lVar43 * 4 + 1];
              iVar62 = iVar62 + (uint)pPixels[lVar43 * 4];
              iVar63 = iVar63 + (uint)pPixels[lVar43 * 4 + 2];
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0x10);
          fVar67 = (float)(uVar11 >> 0x10 & 0xff);
          uVar41 = uVar11 >> 8 & 0xff;
          fVar64 = fVar67 * (float)(uVar11 & 0xff) - (float)(uVar41 * uVar41);
          if (ABS(fVar64) < 1e-08) {
            local_280 = (ulong)(byte)g_bc1_match5_half[lVar16];
            local_248 = (ulong)(byte)g_bc1_match6_half[lVar18];
            local_278 = (ulong)(byte)g_bc1_match5_half[lVar6];
            local_2f0 = (ulong)(byte)g_bc1_match5_half[lVar16 + 1];
            local_2e8 = (ulong)(byte)g_bc1_match6_half[lVar18 + 1];
            local_2a0 = (ulong)(byte)g_bc1_match5_half[lVar6 + 1];
          }
          else {
            fVar64 = 0.007843138 / fVar64;
            fVar67 = fVar67 * fVar64;
            fVar58 = -(float)uVar41 * fVar64;
            fVar64 = (float)(uVar11 & 0xff) * fVar64;
            fVar68 = (float)(iVar62 * 2 - iVar65);
            fVar71 = (float)(iVar63 * 2 - iVar66);
            fVar61 = fVar67 * fVar68 + fVar58 * (float)iVar65;
            fVar68 = fVar58 * fVar68 + fVar64 * (float)iVar65;
            fVar70 = fVar67 * fVar71 + fVar58 * (float)iVar66;
            fVar71 = fVar58 * fVar71 + fVar64 * (float)iVar66;
            uVar11 = (uint)(fVar61 * 31.0);
            uVar41 = (uint)(fVar68 * 31.0);
            uVar29 = (uint)(fVar70 * 31.0);
            uVar38 = (uint)(fVar71 * 31.0);
            if (0x1f < (uVar38 | uVar41 | uVar29 | uVar11)) {
              uVar11 = -(uint)((int)0 < (int)uVar11) & uVar11;
              uVar41 = -(uint)((int)0 < (int)uVar41) & uVar41;
              uVar29 = -(uint)((int)0 < (int)uVar29) & uVar29;
              uVar38 = -(uint)((int)0 < (int)uVar38) & uVar38;
              uVar24 = -(uint)((int)uVar11 < 0x1f);
              uVar30 = -(uint)((int)uVar41 < 0x1f);
              uVar39 = -(uint)((int)uVar29 < 0x1f);
              uVar45 = -(uint)((int)uVar38 < 0x1f);
              uVar11 = ~uVar24 & 0x1f | uVar11 & uVar24;
              uVar41 = ~uVar30 & 0x1f | uVar41 & uVar30;
              uVar29 = ~uVar39 & 0x1f | uVar29 & uVar39;
              uVar38 = ~uVar45 & 0x1f | uVar38 & uVar45;
            }
            fVar72 = (float)(iVar40 * 2 - iVar31);
            fVar75 = fVar64 * (float)iVar31 + fVar72 * fVar58;
            fVar64 = fVar58 * (float)iVar31 + fVar67 * fVar72;
            uVar30 = (uint)(fVar75 * 63.0);
            uVar24 = (uint)(fVar64 * 63.0);
            if (0x3f < (uVar24 | uVar30)) {
              if ((int)uVar30 < 1) {
                uVar30 = 0;
              }
              if (0x3e < (int)uVar30) {
                uVar30 = 0x3f;
              }
              if ((int)uVar24 < 1) {
                uVar24 = 0;
              }
              if (0x3e < (int)uVar24) {
                uVar24 = 0x3f;
              }
            }
            local_2f0 = (ulong)((*(float *)(g_midpoint5 + (ulong)uVar41 * 4) <= fVar68 &&
                                fVar68 != *(float *)(g_midpoint5 + (ulong)uVar41 * 4)) + uVar41 &
                               0x1f);
            local_2e8 = (ulong)((*(float *)(g_midpoint6 + (ulong)uVar30 * 4) <= fVar75 &&
                                fVar75 != *(float *)(g_midpoint6 + (ulong)uVar30 * 4)) + uVar30 &
                               0x3f);
            local_2a0 = (ulong)(uVar38 + (*(float *)(g_midpoint5 + (long)(int)uVar38 * 4) <= fVar71
                                         && fVar71 != *(float *)(g_midpoint5 + (long)(int)uVar38 * 4
                                                                )) & 0x1f);
            local_280 = (ulong)(uVar11 + (*(float *)(g_midpoint5 + (long)(int)uVar11 * 4) <= fVar61
                                         && fVar61 != *(float *)(g_midpoint5 + (long)(int)uVar11 * 4
                                                                )) & 0x1f);
            local_248 = (ulong)((*(float *)(g_midpoint6 + (ulong)uVar24 * 4) <= fVar64 &&
                                fVar64 != *(float *)(g_midpoint6 + (ulong)uVar24 * 4)) + uVar24 &
                               0x3f);
            local_278 = (ulong)(uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= fVar70
                                         && fVar70 != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4
                                                                )) & 0x1f);
          }
          uVar51 = (uint32_t)local_280;
          uVar37 = (uint32_t)local_248;
          uVar53 = (uint32_t)local_278;
          uVar48 = (uint32_t)local_2f0;
          if ((((((local_288 == uVar51) && (local_28c == uVar37)) && (local_290 == uVar53)) &&
               ((local_294 == uVar48 && ((uint32_t)local_238 == (uint32_t)local_2e8)))) &&
              ((uint32_t)local_230 == (uint32_t)local_2a0)) ||
             (uVar34 = bc1_find_sels3_fullerr
                                 (false,(color32 *)pPixels,uVar51,uVar37,uVar53,uVar48,
                                  (uint32_t)local_2e8,(uint32_t)local_2a0,round_sels,uVar25),
             uVar25 <= uVar34)) {
            local_2a0 = local_230 & 0xffffffff;
            local_278 = (ulong)local_290;
            local_280 = (ulong)local_288;
            local_2f0 = (ulong)local_294;
            local_248 = (ulong)local_28c;
            local_2e8 = local_238;
            uVar34 = uVar25;
            break;
          }
          trial_sels_1[4] = round_sels[4];
          trial_sels_1[5] = round_sels[5];
          trial_sels_1[6] = round_sels[6];
          trial_sels_1[7] = round_sels[7];
          trial_sels_1[0] = round_sels[0];
          trial_sels_1[1] = round_sels[1];
          trial_sels_1[2] = round_sels[2];
          trial_sels_1[3] = round_sels[3];
          trial_sels_1[8] = round_sels[8];
          trial_sels_1[9] = round_sels[9];
          trial_sels_1[10] = round_sels[10];
          trial_sels_1[0xb] = round_sels[0xb];
          trial_sels_1[0xc] = round_sels[0xc];
          trial_sels_1[0xd] = round_sels[0xd];
          trial_sels_1[0xe] = round_sels[0xe];
          trial_sels_1[0xf] = round_sels[0xf];
          bVar21 = bVar9 & (byte)((flags & 4) >> 2);
          bVar9 = 0;
          local_294 = uVar48;
          local_290 = uVar53;
          local_28c = uVar37;
          local_288 = uVar51;
          local_238 = local_2e8;
          local_230 = local_2a0;
          uVar25 = uVar34;
        } while (bVar21 != 0);
        local_290 = (uint32_t)local_278;
        local_28c = (uint32_t)local_248;
        local_288 = (uint32_t)local_280;
        if (uVar34 == 0) {
          uVar34 = 0;
        }
        else if (total_orderings_to_try3 != 0 && (flags & 2) != 0) {
          _h_1 = _h_1 & 0xff000000;
          lVar43 = 0;
          do {
            h_1.m_hist[trial_sels_1[lVar43]] = h_1.m_hist[trial_sels_1[lVar43]] + '\x01';
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0x10);
          local_250 = 0xc;
          if (h_1.m_hist[0] != '\x10') {
            local_250 = 0xf;
            if (h_1.m_hist[1] != '\x10') {
              local_250 = 0x59;
              if (h_1.m_hist[2] != '\x10') {
                local_250 = (uint)*(ushort *)
                                   (g_total_ordering3_hash +
                                   ((uint)h_1.m_hist[1] << 5 | (_h_1 & 0xff) * 2));
              }
            }
          }
          lVar43 = 0;
          do {
            dots[lVar43] = (uint)pPixels[lVar43 * 4 + 2] *
                           (((uint)(local_2a0 >> 2) | (uint32_t)local_2a0 * 8) -
                           ((uint)(local_278 >> 2) | local_290 * 8)) * 0x10 +
                           (uint)pPixels[lVar43 * 4 + 1] *
                           (((uint)(local_2e8 >> 4) | (uint32_t)local_2e8 * 4) -
                           ((uint)(local_248 >> 4) | local_28c * 4)) * 0x10 +
                           (uint)pPixels[lVar43 * 4] *
                           (((uint)(local_2f0 >> 2) | (uint32_t)local_2f0 * 8) -
                           ((uint)(local_280 >> 2) | local_288 * 8)) * 0x10 + (int)lVar43 +
                           0x10000000;
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0x10);
          std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(dots);
          lVar43 = 0;
          uVar25 = 0;
          iVar31 = 0;
          iVar40 = 0;
          do {
            uVar17 = (ulong)(dots[lVar43] & 0xf);
            *(int *)(round_sels + lVar43 * 4) = iVar40;
            *(int *)(trial_sels + lVar43 * 4) = iVar31;
            b_sum[lVar43] = uVar25;
            iVar40 = iVar40 + (uint)pPixels[uVar17 * 4];
            iVar31 = iVar31 + (uint)pPixels[uVar17 * 4 + 1];
            uVar25 = uVar25 + pPixels[uVar17 * 4 + 2];
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0x10);
          uVar25 = 0x20;
          if (total_orderings_to_try3 < 0x20) {
            uVar25 = total_orderings_to_try3;
          }
          b_sum[0x10] = uVar49;
          uVar17 = 0x99;
          if ((flags >> 0xd & 1) == 0) {
            uVar17 = (ulong)(uVar25 + (uVar25 == 0));
          }
          uVar36 = 0;
          do {
            if ((flags >> 0xd & 1) == 0) {
              uVar11 = (uint)(byte)g_best_total_orderings3[(local_250 << 5) + uVar36];
            }
            else {
              uVar11 = (uint)uVar36;
            }
            if (((uVar11 == 0xc) || (uVar11 == 0x59)) || (uVar11 == 0xf)) {
              uVar35 = (ulong)(byte)g_bc1_match5_half[lVar16];
              uVar41 = (uint)(byte)g_bc1_match6_half[lVar18];
              uVar11 = (uint)(byte)g_bc1_match5_half[lVar6];
              uVar27 = (ulong)(byte)g_bc1_match5_half[lVar16 + 1];
              uVar19 = (ulong)(byte)g_bc1_match6_half[lVar18 + 1];
              uVar42 = (ulong)(byte)g_bc1_match5_half[lVar6 + 1];
            }
            else {
              uVar27 = (ulong)uVar11;
              bVar9 = (&g_unique_total_orders3)[uVar27 * 3];
              uVar42 = (ulong)(((uint)(byte)(&DAT_00125352)[uVar27 * 3] + (uint)bVar9) * 4);
              lVar43 = (ulong)bVar9 * 4;
              uVar11 = (-*(int *)(round_sels + uVar42) - *(int *)(round_sels + lVar43)) + uVar50 * 2
              ;
              fVar75 = (float)(uVar50 * 2 - uVar11);
              uVar41 = (-*(int *)(trial_sels + uVar42) - *(int *)(trial_sels + lVar43)) + uVar44 * 2
              ;
              uVar29 = (-*(int *)((long)b_sum + uVar42) - b_sum[bVar9]) + uVar49 * 2;
              fVar68 = (float)(uVar44 * 2 - uVar41);
              fVar72 = (float)(uVar49 * 2 - uVar29);
              fVar58 = (float)uVar11;
              fVar64 = (float)uVar41;
              fVar76 = (float)uVar29;
              uVar1 = *(undefined8 *)((long)&g_selector_factors3 + uVar27 * 0xc);
              uVar2 = *(undefined8 *)((long)&g_selector_factors3 + uVar27 * 0xc + 4);
              fVar73 = (float)uVar2;
              fVar74 = (float)((ulong)uVar2 >> 0x20);
              fVar61 = (float)uVar1;
              fVar70 = (float)((ulong)uVar1 >> 0x20);
              fVar67 = fVar64 * fVar61 + fVar68 * fVar73;
              fVar64 = fVar64 * fVar70 + fVar68 * fVar74;
              fVar71 = fVar61 * fVar76 + fVar72 * fVar70;
              fVar68 = fVar70 * fVar76 + (float)(&DAT_00170508)[uVar27 * 3] * fVar72;
              uVar41 = (uint)(fVar71 * 31.0);
              fVar61 = fVar58 * fVar61 + fVar75 * fVar73;
              fVar58 = fVar58 * fVar70 + fVar75 * fVar74;
              uVar38 = (uint)(fVar61 * 31.0);
              uVar11 = (uint)(fVar58 * 31.0);
              uVar29 = (uint)(fVar68 * 31.0);
              if (0x1f < (uVar38 | uVar41 | uVar11 | uVar29)) {
                if ((int)uVar38 < 1) {
                  uVar38 = 0;
                }
                if (0x1e < (int)uVar38) {
                  uVar38 = 0x1f;
                }
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                if (0x1e < (int)uVar11) {
                  uVar11 = 0x1f;
                }
                if ((int)uVar41 < 1) {
                  uVar41 = 0;
                }
                if (0x1e < (int)uVar41) {
                  uVar41 = 0x1f;
                }
                if ((int)uVar29 < 1) {
                  uVar29 = 0;
                }
                if (0x1e < (int)uVar29) {
                  uVar29 = 0x1f;
                }
              }
              uVar24 = (uint)(fVar67 * 63.0);
              uVar30 = (uint)(fVar64 * 63.0);
              if (0x3f < (uVar30 | uVar24)) {
                uVar24 = -(uint)((int)0 < (int)uVar24) & uVar24;
                uVar30 = -(uint)((int)0 < (int)uVar30) & uVar30;
                uVar39 = -(uint)((int)uVar24 < 0x3f);
                uVar45 = -(uint)((int)uVar30 < 0x3f);
                uVar24 = ~uVar39 & 0x3f | uVar24 & uVar39;
                uVar30 = ~uVar45 & 0x3f | uVar30 & uVar45;
              }
              uVar27 = (ulong)((*(float *)(g_midpoint5 + (ulong)uVar38 * 4) <= fVar61 &&
                               fVar61 != *(float *)(g_midpoint5 + (ulong)uVar38 * 4)) + uVar38 &
                              0x1f);
              uVar19 = (ulong)((*(float *)(g_midpoint6 + (ulong)uVar24 * 4) <= fVar67 &&
                               fVar67 != *(float *)(g_midpoint6 + (ulong)uVar24 * 4)) + uVar24 &
                              0x3f);
              uVar42 = (ulong)(uVar41 + (*(float *)(g_midpoint5 + (long)(int)uVar41 * 4) <= fVar71
                                        && fVar71 != *(float *)(g_midpoint5 + (long)(int)uVar41 * 4)
                                        ) & 0x1f);
              uVar35 = (ulong)(uVar11 + (*(float *)(g_midpoint5 + (long)(int)uVar11 * 4) <= fVar58
                                        && fVar58 != *(float *)(g_midpoint5 + (long)(int)uVar11 * 4)
                                        ) & 0x1f);
              uVar41 = (*(float *)(g_midpoint6 + (ulong)uVar30 * 4) <= fVar64 &&
                       fVar64 != *(float *)(g_midpoint6 + (ulong)uVar30 * 4)) + uVar30 & 0x3f;
              uVar11 = (*(float *)(g_midpoint5 + (ulong)uVar29 * 4) <= fVar68 &&
                       fVar68 != *(float *)(g_midpoint5 + (ulong)uVar29 * 4)) + uVar29 & 0x1f;
            }
            uVar25 = bc1_find_sels3_fullerr
                               (false,(color32 *)pPixels,(uint32_t)uVar35,uVar41,uVar11,
                                (uint32_t)uVar27,(uint32_t)uVar19,(uint32_t)uVar42,h.m_hist,
                                0xffffffff);
            if (uVar25 < uVar34) {
              trial_sels_1[1] = h.m_hist[1];
              trial_sels_1[0] = h.m_hist[0];
              trial_sels_1[2] = h.m_hist[2];
              trial_sels_1[3] = h.m_hist[3];
              trial_sels_1._4_4_ = uStack_214;
              trial_sels_1._8_8_ = uStack_210;
              local_278 = (ulong)uVar11;
              local_248 = (ulong)uVar41;
              uVar34 = uVar25;
              local_2f0 = uVar27;
              local_2e8 = uVar19;
              local_2a0 = uVar42;
              local_280 = uVar35;
            }
            uVar36 = uVar36 + 1;
            local_288 = (uint32_t)local_280;
            local_28c = (uint32_t)local_248;
            local_290 = (uint32_t)local_278;
          } while (uVar17 != uVar36);
        }
      }
      auVar8 = trial_sels_1;
      trial_sels_1 = auVar8;
      if (uVar34 < uVar23) {
        results.m_3color = true;
        results.hr = (uint32_t)local_2f0;
        results.hb = (uint32_t)local_2a0;
        results.hg = (uint32_t)local_2e8;
        results.sels[0] = trial_sels_1[0];
        results.sels[1] = trial_sels_1[1];
        results.sels[2] = trial_sels_1[2];
        results.sels[3] = trial_sels_1[3];
        results.sels[4] = trial_sels_1[4];
        results.sels[5] = trial_sels_1[5];
        results.sels[6] = trial_sels_1[6];
        results.sels[7] = trial_sels_1[7];
        results.sels[8] = trial_sels_1[8];
        results.sels[9] = trial_sels_1[9];
        results.sels[10] = trial_sels_1[10];
        results.sels[0xb] = trial_sels_1[0xb];
        results.sels[0xc] = trial_sels_1[0xc];
        results.sels[0xd] = trial_sels_1[0xd];
        results.sels[0xe] = trial_sels_1[0xe];
        results.sels[0xf] = trial_sels_1[0xf];
        results.lr = local_288;
        results.lg = local_28c;
        results.lb = local_290;
        uVar23 = uVar34;
      }
    }
    if (((flags & 8) != 0) && (bVar56)) {
      uVar49 = 0xff;
      lVar16 = 0;
      iVar31 = 0;
      iVar63 = 0;
      iVar62 = 0;
      iVar40 = 0;
      uVar11 = 0;
      uVar44 = 0;
      uVar50 = 0;
      uVar29 = 0xff;
      uVar41 = 0xff;
      do {
        bVar9 = pPixels[lVar16 * 4];
        uVar38 = (uint)pPixels[lVar16 * 4 + 1];
        bVar21 = pPixels[lVar16 * 4 + 2];
        if (3 < (byte)(pPixels[lVar16 * 4 + 1] | bVar9 | bVar21)) {
          uVar24 = (uint)bVar9;
          if (uVar11 <= uVar24) {
            uVar11 = uVar24;
          }
          if (uVar44 <= uVar38) {
            uVar44 = uVar38;
          }
          uVar30 = (uint)bVar21;
          if (uVar50 <= uVar30) {
            uVar50 = uVar30;
          }
          if (uVar24 <= uVar41) {
            uVar41 = (uint)bVar9;
          }
          if (uVar38 <= uVar29) {
            uVar29 = uVar38;
          }
          if (uVar30 <= uVar49) {
            uVar49 = (uint)bVar21;
          }
          iVar31 = iVar31 + (uint)bVar9;
          iVar63 = iVar63 + uVar38;
          iVar62 = iVar62 + (uint)bVar21;
          iVar40 = iVar40 + 1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      if (iVar40 != 0) {
        iVar65 = iVar40 >> 1;
        iVar31 = (iVar31 + iVar65) / iVar40;
        iVar63 = (iVar63 + iVar65) / iVar40;
        iVar40 = (iVar62 + iVar65) / iVar40;
        lVar16 = 0;
        iVar66 = 0;
        iVar62 = 0;
        iVar65 = 0;
        iVar55 = 0;
        iVar54 = 0;
        do {
          if (3 < (byte)(pPixels[lVar16 * 4 + 1] | pPixels[lVar16 * 4] | pPixels[lVar16 * 4 + 2])) {
            iVar15 = (uint)pPixels[lVar16 * 4] - iVar31;
            iVar26 = (uint)pPixels[lVar16 * 4 + 1] - iVar63;
            iVar52 = (uint)pPixels[lVar16 * 4 + 2] - iVar40;
            iVar54 = iVar54 + iVar15 * iVar15;
            iVar55 = iVar55 + iVar26 * iVar15;
            iVar65 = iVar65 + iVar15 * iVar52;
            iVar62 = iVar62 + iVar26 * iVar26;
            iVar66 = iVar66 + iVar52 * iVar26;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        round_sels[4] = (char)iVar55;
        round_sels[5] = (char)((uint)iVar55 >> 8);
        round_sels[6] = (char)((uint)iVar55 >> 0x10);
        round_sels[7] = (char)((uint)iVar55 >> 0x18);
        round_sels[8] = (char)iVar65;
        round_sels[9] = (char)((uint)iVar65 >> 8);
        round_sels[10] = (char)((uint)iVar65 >> 0x10);
        round_sels[0xb] = (char)((uint)iVar65 >> 0x18);
        round_sels[0xc] = (char)iVar62;
        round_sels[0xd] = (char)((uint)iVar62 >> 8);
        round_sels[0xe] = (char)((uint)iVar62 >> 0x10);
        round_sels[0xf] = (char)((uint)iVar62 >> 0x18);
        round_sels[0] = (char)iVar54;
        round_sels[1] = (char)((uint)iVar54 >> 8);
        round_sels[2] = (char)((uint)iVar54 >> 0x10);
        round_sels[3] = (char)((uint)iVar54 >> 0x18);
        lVar16 = 0;
        do {
          *(float *)(trial_sels + lVar16 * 4) =
               (float)*(int *)(round_sels + lVar16 * 4) * 0.003921569;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        fVar64 = (float)(int)(uVar11 - uVar41);
        if (iVar65 < 0) {
          fVar64 = -fVar64;
        }
        fVar67 = (float)(int)(uVar44 - uVar29);
        if (iVar66 < 0) {
          fVar67 = -fVar67;
        }
        fVar61 = (float)(int)(uVar50 - uVar49);
        iVar62 = 4;
        fVar58 = 0.0;
        do {
          fVar70 = fVar58;
          fVar68 = fVar61 * (float)trial_sels._8_4_ +
                   fVar64 * (float)trial_sels._0_4_ + (float)trial_sels._4_4_ * fVar67;
          fVar58 = fVar67 * (float)local_108;
          fVar67 = fVar61 * (float)local_108 +
                   fVar64 * (float)trial_sels._4_4_ + fVar67 * (float)trial_sels._12_4_;
          fVar61 = fVar61 * (float)((ulong)local_108 >> 0x20) +
                   fVar64 * (float)trial_sels._8_4_ + fVar58;
          iVar62 = iVar62 + -1;
          fVar64 = fVar68;
          fVar58 = fVar61;
        } while (iVar62 != 0);
        auVar69._0_4_ = ABS(fVar68);
        auVar69._4_4_ = 0;
        auVar69._8_4_ = ABS(fVar70);
        auVar69._12_4_ = ABS(fVar70);
        if (auVar69._0_4_ <= ABS(fVar67)) {
          auVar69._0_4_ = ABS(fVar67);
        }
        if (auVar69._0_4_ <= ABS(fVar61)) {
          auVar69._0_4_ = ABS(fVar61);
        }
        if (2.0 <= auVar69._0_4_) {
          fVar64 = 1024.0 / auVar69._0_4_;
          iVar62 = (int)(fVar68 * fVar64);
          iVar65 = (int)(fVar67 * fVar64);
          iVar66 = (int)(fVar61 * fVar64);
        }
        else {
          iVar65 = 0x259;
          iVar66 = 0x75;
          iVar62 = 0x132;
        }
        lVar16 = 0;
        iVar54 = 0x7fffffff;
        iVar55 = -0x80000000;
        uVar11 = 0;
        uVar44 = 0;
        do {
          if (3 < (byte)(pPixels[lVar16 * 4 + 1] | pPixels[lVar16 * 4] | pPixels[lVar16 * 4 + 2])) {
            iVar15 = (uint)pPixels[lVar16 * 4 + 2] * iVar66 +
                     (uint)pPixels[lVar16 * 4 + 1] * iVar65 + (uint)pPixels[lVar16 * 4] * iVar62;
            if (iVar15 < iVar54) {
              iVar54 = iVar15;
              uVar11 = (uint)lVar16;
            }
            if (iVar55 < iVar15) {
              uVar44 = (uint)lVar16;
              iVar55 = iVar15;
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x10);
        uVar17 = (ulong)uVar11;
        uVar50 = ((uint)pPixels[uVar17 * 4] * 0x1f + 0x80 >> 8) + (uint)pPixels[uVar17 * 4] * 0x1f +
                 0x80 >> 8;
        local_328 = ((uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8) +
                    (uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8;
        local_300 = ((uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8;
        uVar17 = (ulong)uVar44;
        local_308 = ((uint)pPixels[uVar17 * 4] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[uVar17 * 4] * 0x1f + 0x80 >> 8;
        uVar11 = ((uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8) +
                 (uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8;
        uVar44 = ((uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8) +
                 (uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8;
        uVar41 = bc1_find_sels3_fullerr
                           (true,(color32 *)pPixels,uVar50,local_328,local_300,local_308,uVar11,
                            uVar44,(uint8_t *)b_sum,0xffffffff);
        if (uVar41 == 0) {
          uVar41 = 0;
        }
        else {
          lVar16 = (long)iVar31 * 3;
          lVar18 = (long)iVar63 * 3;
          lVar6 = (long)iVar40 * 3;
          bVar9 = 1;
          do {
            lVar43 = 0;
            iVar31 = 0;
            uVar29 = 0;
            iVar40 = 0;
            iVar65 = 0;
            iVar66 = 0;
            iVar62 = 0;
            iVar63 = 0;
            do {
              bVar21 = pPixels[lVar43 * 4];
              bVar3 = pPixels[lVar43 * 4 + 2];
              bVar4 = pPixels[lVar43 * 4 + 1];
              if ((3 < (byte)(bVar4 | bVar21 | bVar3)) &&
                 (uVar17 = (ulong)*(byte *)((long)b_sum + lVar43), uVar17 != 3)) {
                uVar29 = uVar29 + (&g_weight_vals3)[uVar17];
                bVar5 = *(byte *)((long)&compute_least_squares_endpoints3_rgb(bool,rgbcx::color32_const*,unsigned_char_const*,rgbcx::vec3F*,rgbcx::vec3F*)
                                         ::s_tran + uVar17);
                auVar60._8_8_ = 0;
                auVar60._0_8_ = (ulong)bVar21 | (ulong)(uint)bVar3 << 0x20;
                iVar31 = iVar31 + (uint)bVar5 * (uint)bVar4;
                auVar59 = pmaddwd(ZEXT516(CONCAT14(bVar5,(uint)bVar5)),auVar60);
                iVar65 = iVar65 + auVar59._0_4_;
                iVar66 = iVar66 + auVar59._4_4_;
                iVar40 = iVar40 + (uint)bVar4;
                iVar62 = iVar62 + (uint)bVar21;
                iVar63 = iVar63 + (uint)bVar3;
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 != 0x10);
            fVar67 = (float)(uVar29 >> 0x10 & 0xff);
            uVar49 = uVar29 >> 8 & 0xff;
            fVar64 = fVar67 * (float)(uVar29 & 0xff) - (float)(uVar49 * uVar49);
            if (ABS(fVar64) < 1e-08) {
              uVar51 = (uint32_t)(byte)g_bc1_match5_half[lVar16];
              uVar25 = (uint32_t)(byte)g_bc1_match6_half[lVar18];
              uVar34 = (uint32_t)(byte)g_bc1_match5_half[lVar6];
              uVar53 = (uint32_t)(byte)g_bc1_match5_half[lVar16 + 1];
              uVar37 = (uint32_t)(byte)g_bc1_match6_half[lVar18 + 1];
              uVar48 = (uint32_t)(byte)g_bc1_match5_half[lVar6 + 1];
            }
            else {
              fVar64 = 0.007843138 / fVar64;
              fVar67 = fVar67 * fVar64;
              fVar58 = -(float)uVar49 * fVar64;
              fVar64 = (float)(uVar29 & 0xff) * fVar64;
              fVar68 = (float)(iVar62 * 2 - iVar65);
              fVar71 = (float)(iVar63 * 2 - iVar66);
              fVar61 = fVar67 * fVar68 + fVar58 * (float)iVar65;
              fVar68 = fVar58 * fVar68 + fVar64 * (float)iVar65;
              fVar70 = fVar67 * fVar71 + fVar58 * (float)iVar66;
              fVar71 = fVar58 * fVar71 + fVar64 * (float)iVar66;
              uVar29 = (uint)(fVar61 * 31.0);
              uVar49 = (uint)(fVar68 * 31.0);
              uVar38 = (uint)(fVar70 * 31.0);
              uVar24 = (uint)(fVar71 * 31.0);
              if (0x1f < (uVar24 | uVar49 | uVar38 | uVar29)) {
                uVar29 = -(uint)((int)0 < (int)uVar29) & uVar29;
                uVar49 = -(uint)((int)0 < (int)uVar49) & uVar49;
                uVar38 = -(uint)((int)0 < (int)uVar38) & uVar38;
                uVar24 = -(uint)((int)0 < (int)uVar24) & uVar24;
                uVar30 = -(uint)((int)uVar29 < 0x1f);
                uVar39 = -(uint)((int)uVar49 < 0x1f);
                uVar45 = -(uint)((int)uVar38 < 0x1f);
                uVar12 = -(uint)((int)uVar24 < 0x1f);
                uVar29 = ~uVar30 & 0x1f | uVar29 & uVar30;
                uVar49 = ~uVar39 & 0x1f | uVar49 & uVar39;
                uVar38 = ~uVar45 & 0x1f | uVar38 & uVar45;
                uVar24 = ~uVar12 & 0x1f | uVar24 & uVar12;
              }
              fVar72 = (float)(iVar40 * 2 - iVar31);
              fVar75 = fVar64 * (float)iVar31 + fVar72 * fVar58;
              fVar64 = fVar58 * (float)iVar31 + fVar67 * fVar72;
              uVar39 = (uint)(fVar75 * 63.0);
              uVar30 = (uint)(fVar64 * 63.0);
              if (0x3f < (uVar30 | uVar39)) {
                if ((int)uVar39 < 1) {
                  uVar39 = 0;
                }
                if (0x3e < (int)uVar39) {
                  uVar39 = 0x3f;
                }
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                if (0x3e < (int)uVar30) {
                  uVar30 = 0x3f;
                }
              }
              uVar53 = (*(float *)(g_midpoint5 + (ulong)uVar49 * 4) <= fVar68 &&
                       fVar68 != *(float *)(g_midpoint5 + (ulong)uVar49 * 4)) + uVar49 & 0x1f;
              uVar37 = (*(float *)(g_midpoint6 + (ulong)uVar39 * 4) <= fVar75 &&
                       fVar75 != *(float *)(g_midpoint6 + (ulong)uVar39 * 4)) + uVar39 & 0x3f;
              uVar48 = uVar24 + (*(float *)(g_midpoint5 + (long)(int)uVar24 * 4) <= fVar71 &&
                                fVar71 != *(float *)(g_midpoint5 + (long)(int)uVar24 * 4)) & 0x1f;
              uVar51 = uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= fVar61 &&
                                fVar61 != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4)) & 0x1f;
              uVar25 = (*(float *)(g_midpoint6 + (ulong)uVar30 * 4) <= fVar64 &&
                       fVar64 != *(float *)(g_midpoint6 + (ulong)uVar30 * 4)) + uVar30 & 0x3f;
              uVar34 = uVar38 + (*(float *)(g_midpoint5 + (long)(int)uVar38 * 4) <= fVar70 &&
                                fVar70 != *(float *)(g_midpoint5 + (long)(int)uVar38 * 4)) & 0x1f;
            }
            if (((((uVar50 == uVar51) && (local_328 == uVar25)) && (local_300 == uVar34)) &&
                (((local_308 == uVar53 && (uVar11 == uVar37)) && (uVar44 == uVar48)))) ||
               (uVar14 = bc1_find_sels3_fullerr
                                   (true,(color32 *)pPixels,uVar51,uVar25,uVar34,uVar53,uVar37,
                                    uVar48,(uint8_t *)dots,uVar41), uVar41 <= uVar14)) break;
            b_sum[1] = dots[1];
            b_sum[2] = dots[2];
            b_sum[3] = dots[3];
            b_sum[0] = dots[0];
            bVar21 = bVar9 & (byte)((flags & 4) >> 2);
            bVar9 = 0;
            uVar50 = uVar51;
            local_308 = uVar53;
            local_328 = uVar25;
            uVar41 = uVar14;
            local_300 = uVar34;
            uVar11 = uVar37;
            uVar44 = uVar48;
          } while (bVar21 != 0);
        }
        if (uVar41 < uVar23) {
          results.m_3color = true;
          results.hb = uVar44;
          results.hg = uVar11;
          results.sels._0_8_ = b_sum._0_8_;
          results.sels._8_8_ = b_sum._8_8_;
          results.lr = uVar50;
          results.lg = local_328;
          results.lb = local_300;
          results.hr = local_308;
          uVar23 = uVar41;
        }
      }
    }
  }
  bVar57 = results.m_3color;
  if ((0x3fffff < flags) && (uVar23 != 0)) {
    local_328 = results.hb;
    local_300 = results.hg;
    local_2e0 = results.hr;
    local_308 = results.lb;
    local_320 = results.lr;
    local_2f0._0_4_ = results.lg;
    uVar44 = 0xffffffff;
    uVar11 = 0;
    uVar50 = 0;
    do {
      if (uVar44 != (uVar50 & 0x1f)) {
        uVar17 = (ulong)(uVar50 & 0xf);
        if ((uVar50 & 0x10) == 0) {
          uVar48 = (int)(char)s_adjacent_voxels[uVar17 * 4] + local_2e0;
          if (0x1e < (int)uVar48) {
            uVar48 = 0x1f;
          }
          if ((int)uVar48 < 1) {
            uVar48 = 0;
          }
          uVar51 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 1] + local_300;
          if (0x3e < (int)uVar51) {
            uVar51 = 0x3f;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          local_318 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 2] + local_328;
          if (0x1e < (int)local_318) {
            local_318 = 0x1f;
          }
          uVar25 = local_320;
          uVar34 = (uint32_t)local_2f0;
          uVar37 = local_308;
          if ((int)local_318 < 1) {
            local_318 = 0;
          }
        }
        else {
          uVar25 = (int)(char)s_adjacent_voxels[uVar17 * 4] + local_320;
          if (0x1e < (int)uVar25) {
            uVar25 = 0x1f;
          }
          if ((int)uVar25 < 1) {
            uVar25 = 0;
          }
          uVar34 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 1] + (uint32_t)local_2f0;
          if (0x3e < (int)uVar34) {
            uVar34 = 0x3f;
          }
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          uVar37 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 2] + local_308;
          if (0x1e < (int)uVar37) {
            uVar37 = 0x1f;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          local_318 = local_328;
          uVar48 = local_2e0;
          uVar51 = local_300;
        }
        if ((bVar57 & 1U) == 0) {
          uVar41 = bc1_find_sels4(flags,(color32 *)pPixels,uVar25,uVar34,uVar37,uVar48,uVar51,
                                  local_318,round_sels,uVar23);
        }
        else {
          uVar41 = bc1_find_sels3_fullerr
                             ((bool)((byte)flags >> 3 & bVar56),(color32 *)pPixels,uVar25,uVar34,
                              uVar37,uVar48,uVar51,local_318,round_sels,uVar23);
        }
        if (uVar41 < uVar23) {
          uVar44 = uVar50 & 0x10 | (int)(char)s_adjacent_voxels[uVar17 * 4 + 3];
          local_328 = local_318;
          results.hb = local_318;
          results.hg = uVar51;
          results.sels[0] = round_sels[0];
          results.sels[1] = round_sels[1];
          results.sels[2] = round_sels[2];
          results.sels[3] = round_sels[3];
          results.sels[4] = round_sels[4];
          results.sels[5] = round_sels[5];
          results.sels[6] = round_sels[6];
          results.sels[7] = round_sels[7];
          results.sels[8] = round_sels[8];
          results.sels[9] = round_sels[9];
          results.sels[10] = round_sels[10];
          results.sels[0xb] = round_sels[0xb];
          results.sels[0xc] = round_sels[0xc];
          results.sels[0xd] = round_sels[0xd];
          results.sels[0xe] = round_sels[0xe];
          results.sels[0xf] = round_sels[0xf];
          results.lr = uVar25;
          results.lg = uVar34;
          results.lb = uVar37;
          results.hr = uVar48;
          local_300 = uVar51;
          local_2e0 = uVar48;
          local_308 = uVar37;
          local_2f0._0_4_ = uVar34;
          local_320 = uVar25;
          uVar23 = uVar41;
          uVar11 = uVar50;
        }
        if (0x20 < (int)(uVar50 - uVar11)) break;
      }
      uVar50 = uVar50 + 1;
    } while (flags >> 0x16 != uVar50);
  }
  if ((bVar57 & 1U) == 0) {
    uVar44 = results.lr << 0xb | results.lb | results.lg << 5;
    uVar11 = uVar44 & 0xffff;
    sVar10 = (short)uVar44;
    uVar44 = results.hr << 0xb | results.hb | results.hg << 5;
    uVar50 = uVar44 & 0xffff;
    sVar22 = (short)uVar44;
    if (uVar11 != uVar50) {
      sVar32 = sVar22;
      if (uVar11 >= uVar50 && uVar11 != uVar50) {
        sVar32 = sVar10;
      }
      if (uVar11 < uVar50) {
        sVar22 = sVar10;
      }
      *(char *)pDst = (char)sVar32;
      *(char *)((long)pDst + 1) = (char)((ushort)sVar32 >> 8);
      *(char *)((long)pDst + 2) = (char)sVar22;
      *(char *)((long)pDst + 3) = (char)((ushort)sVar22 >> 8);
      lVar16 = 0;
      uVar44 = 0;
      puVar47 = results.sels;
      do {
        uVar44 = uVar44 | (uint)*(byte *)((long)&bc1_encode4(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                                 ::s_sel_trans + (ulong)*puVar47) <<
                          ((byte)lVar16 & 0x1f);
        lVar16 = lVar16 + 2;
        puVar47 = puVar47 + 1;
      } while (lVar16 != 0x20);
      bVar9 = 0x55;
      if (uVar50 <= uVar11) {
        bVar9 = 0;
      }
      *(byte *)((long)pDst + 4) = (byte)uVar44 ^ bVar9;
      *(byte *)((long)pDst + 5) = (byte)(uVar44 >> 8) ^ bVar9;
      *(byte *)((long)pDst + 6) = (byte)(uVar44 >> 0x10) ^ bVar9;
      *(byte *)((long)pDst + 7) = (byte)(uVar44 >> 0x18) ^ bVar9;
      return;
    }
    bVar56 = uVar11 == 0;
    sVar32 = sVar10;
    if (bVar56) {
      sVar32 = 1;
    }
    *(char *)pDst = (char)sVar32;
    *(char *)((long)pDst + 1) = (char)((ushort)sVar32 >> 8);
    sVar22 = sVar22 + -1;
    if (bVar56) {
      sVar22 = sVar10;
    }
    *(char *)((long)pDst + 2) = (char)sVar22;
    *(char *)((long)pDst + 3) = (char)((ushort)sVar22 >> 8);
    uVar11 = 0x55555555;
    if (!bVar56) {
      uVar11 = 0;
    }
  }
  else {
    uVar11 = results.lr << 0xb | results.lb | results.lg << 5;
    uVar44 = results.hr << 0xb | results.hb | results.hg << 5;
    uVar28 = (undefined1)(uVar44 >> 8);
    uVar20 = (undefined1)(uVar11 >> 8);
    if ((uVar44 & 0xffff) < (uVar11 & 0xffff)) {
      *(char *)pDst = (char)uVar44;
      *(undefined1 *)((long)pDst + 1) = uVar28;
      *(char *)((long)pDst + 2) = (char)uVar11;
      *(undefined1 *)((long)pDst + 3) = uVar20;
      lVar16 = 0;
      uVar11 = 0;
      puVar47 = results.sels;
      do {
        uVar11 = uVar11 | (uint)*(byte *)((long)&bc1_encode3(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                                 ::s_sel_trans_inv + (ulong)*puVar47) <<
                          ((byte)lVar16 & 0x1f);
        lVar16 = lVar16 + 2;
        puVar47 = puVar47 + 1;
      } while (lVar16 != 0x20);
    }
    else {
      *(char *)pDst = (char)uVar11;
      *(undefined1 *)((long)pDst + 1) = uVar20;
      *(char *)((long)pDst + 2) = (char)uVar44;
      *(undefined1 *)((long)pDst + 3) = uVar28;
      lVar16 = 0;
      uVar11 = 0;
      puVar47 = results.sels;
      do {
        uVar11 = uVar11 | (uint)*puVar47 << ((byte)lVar16 & 0x1f);
        lVar16 = lVar16 + 2;
        puVar47 = puVar47 + 1;
      } while (lVar16 != 0x20);
    }
  }
  *(uint *)((long)pDst + 4) = uVar11;
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags, uint32_t total_orderings_to_try, uint32_t total_orderings_to_try3)
	{
		assert(g_initialized);
				
		const color32* pSrc_pixels = (const color32*)pPixels;
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);
		
		int avg_r, avg_g, avg_b, min_r, min_g, min_b, max_r, max_g, max_b;
						
		const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

		uint32_t j;
		for (j = 15; j >= 1; --j)
			if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
				break;

		if (j == 0)
		{
			encode_bc1_solid_block(pDst, fr, fg, fb, (flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0);
			return;
		}

		int total_r = fr, total_g = fg, total_b = fb;
		
		max_r = fr, max_g = fg, max_b = fb;
		min_r = fr, min_g = fg, min_b = fb;
		
		uint32_t grayscale_flag = (fr == fg) && (fr == fb);
		uint32_t any_black_pixels = (fr | fg | fb) < 4;

		for (uint32_t i = 1; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
			
			grayscale_flag &= ((r == g) && (r == b));
			any_black_pixels |= ((r | g | b) < 4);

			max_r = std::max(max_r, r); max_g = std::max(max_g, g); max_b = std::max(max_b, b);
			min_r = std::min(min_r, r); min_g = std::min(min_g, g); min_b = std::min(min_b, b);
			total_r += r; total_g += g; total_b += b;
		}

		avg_r = (total_r + 8) >> 4, avg_g = (total_g + 8) >> 4, avg_b = (total_b + 8) >> 4;

		bc1_encode_results results;
		results.m_3color = false;

		uint8_t *sels = results.sels;
		int &lr = results.lr, &lg = results.lg, &lb = results.lb, &hr = results.hr, &hg = results.hg, &hb = results.hb;
		int orig_lr = 0, orig_lg = 0, orig_lb = 0, orig_hr = 0, orig_hg = 0, orig_hb = 0;

		lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
								
		const bool needs_block_error = ((flags & (cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use3ColorBlocks | cEncodeBC1UseFullMSEEval | cEncodeBC1EndpointSearchRoundsMask)) != 0) ||
				(any_black_pixels && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0));
		
		uint32_t cur_err = UINT32_MAX;

		if (!needs_block_error)
		{
			assert((flags & cEncodeBC1TryAllInitialEndponts) == 0);

			encode_bc1_pick_initial(pSrc_pixels, flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					lr, lg, lb, hr, hg, hb);

			orig_lr = lr, orig_lg = lg, orig_lb = lb, orig_hr = hr, orig_hg = hg, orig_hb = hb;

			bc1_find_sels4_noerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);

			const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
			for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
			{
				int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

				vec3F xl, xh;
				if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, sels, &xl, &xh, total_r, total_g, total_b))
				{
					// All selectors equal - treat it as a solid block which should always be equal or better.
					trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
					trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
					trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

					trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
					trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
					trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

					// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
				}
				else
				{
					precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
				}

				if ((lr == trial_lr) && (lg == trial_lg) && (lb == trial_lb) && (hr == trial_hr) && (hg == trial_hg) && (hb == trial_hb))
					break;
			
				bc1_find_sels4_noerr(pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, sels);

				lr = trial_lr;
				lg = trial_lg;
				lb = trial_lb;
				hr = trial_hr;
				hg = trial_hg;
				hb = trial_hb;

			} // ls_pass
		}
		else
		{
			const uint32_t total_rounds = (flags & cEncodeBC1TryAllInitialEndponts) ? 2 : 1;
			for (uint32_t round = 0; round < total_rounds; round++)
			{
				uint32_t modified_flags = flags;
				if (round == 1)
				{
					modified_flags &= ~(cEncodeBC1Use2DLS | cEncodeBC1BoundingBox);
					modified_flags |= cEncodeBC1BoundingBox;
				}

				int round_lr, round_lg, round_lb, round_hr, round_hg, round_hb;
				uint8_t round_sels[16];

				encode_bc1_pick_initial(pSrc_pixels, modified_flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					round_lr, round_lg, round_lb, round_hr, round_hg, round_hb);

				int orig_round_lr = round_lr, orig_round_lg = round_lg, orig_round_lb = round_lb, orig_round_hr = round_hr, orig_round_hg = round_hg, orig_round_hb = round_hb;

				uint32_t round_err = bc1_find_sels4(flags, pSrc_pixels, round_lr, round_lg, round_lb, round_hr, round_hg, round_hb, round_sels, UINT32_MAX);
						
				const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
				for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
				{
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;
					if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, round_sels, &xl, &xh, total_r, total_g, total_b))
					{
						// All selectors equal - treat it as a solid block which should always be equal or better.
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

						// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
					}
					else
					{
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}

					if ((round_lr == trial_lr) && (round_lg == trial_lg) && (round_lb == trial_lb) && (round_hr == trial_hr) && (round_hg == trial_hg) && (round_hb == trial_hb))
						break;
			
					uint8_t trial_sels[16];
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, round_err);
														
					if (trial_err < round_err)
					{
						round_lr = trial_lr;
						round_lg = trial_lg;
						round_lb = trial_lb;

						round_hr = trial_hr;
						round_hg = trial_hg;
						round_hb = trial_hb;

						round_err = trial_err;
						memcpy(round_sels, trial_sels, 16);
					}
					else
						break;

				} // ls_pass

				if (round_err <= cur_err)
				{
					cur_err = round_err;
				
					lr = round_lr;
					lg = round_lg;
					lb = round_lb;
					hr = round_hr;
					hg = round_hg;
					hb = round_hb;

					orig_lr = orig_round_lr;
					orig_lg = orig_round_lg;
					orig_lb = orig_round_lb;
					orig_hr = orig_round_hr;
					orig_hg = orig_round_hg;
					orig_hb = orig_round_hb;

					memcpy(sels, round_sels, 16);
				}

			} // round
		}
				
		if ((cur_err) && (flags & cEncodeBC1UseLikelyTotalOrderings))
		{
			assert(needs_block_error);

			const uint32_t total_iters = (flags & cEncodeBC1Iterative) ? 2 : 1;
			for (uint32_t iter_index = 0; iter_index < total_iters; iter_index++)
			{
				const uint32_t orig_err = cur_err;
								
				hist4 h;
				for (uint32_t i = 0; i < 16; i++)
				{
					assert(sels[i] < 4);
					h.m_hist[sels[i]]++;
				}

				const uint32_t orig_total_order_index = h.lookup_total_ordering_index();

				int r0, g0, b0, r3, g3, b3;
				r0 = (lr << 3) | (lr >> 2); g0 = (lg << 2) | (lg >> 4); b0 = (lb << 3) | (lb >> 2);
				r3 = (hr << 3) | (hr >> 2); g3 = (hg << 2) | (hg >> 4); b3 = (hb << 3) | (hb >> 2);
										
				int ar = r3 - r0, ag = g3 - g0, ab = b3 - b0;
												
				int dots[16];
				for (uint32_t i = 0; i < 16; i++)
				{
					int r = pSrc_pixels[i].r;
					int g = pSrc_pixels[i].g;
					int b = pSrc_pixels[i].b;
					int d = 0x1000000 + (r * ar + g * ag + b * ab);
					assert(d >= 0);
					dots[i] = (d << 4) + i;
				}

				std::sort(dots, dots + 16);
								
				uint32_t r_sum[17], g_sum[17], b_sum[17];
				uint32_t r = 0, g = 0, b = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					const uint32_t p = dots[i] & 15;

					r_sum[i] = r;
					g_sum[i] = g;
					b_sum[i] = b;
										
					r += pSrc_pixels[p].r;
					g += pSrc_pixels[p].g;
					b += pSrc_pixels[p].b;
				}

				r_sum[16] = total_r;
				g_sum[16] = total_g;
				b_sum[16] = total_b;

				const uint32_t q_total = (flags & cEncodeBC1Exhaustive) ? NUM_UNIQUE_TOTAL_ORDERINGS4 : clampi(total_orderings_to_try, MIN_TOTAL_ORDERINGS, MAX_TOTAL_ORDERINGS4);
				for (uint32_t q = 0; q < q_total; q++)
				{
					const uint32_t s = (flags & cEncodeBC1Exhaustive) ? q : g_best_total_orderings4[orig_total_order_index][q];
	
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;

					if ((s == TOTAL_ORDER_4_0_16) || (s == TOTAL_ORDER_4_1_16) || (s == TOTAL_ORDER_4_2_16) || (s == TOTAL_ORDER_4_3_16))
					{
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;
					}
					else
					{
						compute_least_squares_endpoints4_rgb(&xl, &xh, total_r, total_g, total_b, 
							g_selector_factors4[s][0], g_selector_factors4[s][1], g_selector_factors4[s][2], s, r_sum, g_sum, b_sum);
				
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}
										
					uint8_t trial_sels[16];
					
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);

					if (trial_err < cur_err)
					{
						cur_err = trial_err;

						lr = trial_lr;
						lg = trial_lg;
						lb = trial_lb;

						hr = trial_hr;
						hg = trial_hg;
						hb = trial_hb;

						memcpy(sels, trial_sels, 16);
					}

				} // s

				if ((!cur_err) || (cur_err == orig_err))
					break;
			
			} // iter_index
		}
												
		if ( ((flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0) && (cur_err) )
		{
			if (flags & cEncodeBC1Use3ColorBlocks)
			{
				assert(needs_block_error);
				try_3color_block(pSrc_pixels, flags, cur_err, avg_r, avg_g, avg_b, orig_lr, orig_lg, orig_lb, orig_hr, orig_hg, orig_hb, total_r, total_g, total_b, total_orderings_to_try3, results);
			}

			if ((any_black_pixels) && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0))
			{
				assert(needs_block_error);
				try_3color_block_useblack(pSrc_pixels, flags, cur_err, results);
			}
		}
		
		if ( (flags & cEncodeBC1EndpointSearchRoundsMask) && (cur_err)  )
		{
			assert(needs_block_error);

			encode_bc1_endpoint_search(pSrc_pixels, any_black_pixels != 0, flags, results, cur_err);
		}

		if (results.m_3color)
			bc1_encode3(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
		else
			bc1_encode4(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
	}